

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O2

void __thiscall Wasm::WasmBinaryReader::ReadFunctionSignatures(WasmBinaryReader *this)

{
  uint in_EAX;
  uint uVar1;
  uint32 uVar2;
  uint index;
  WasmSignature *sig;
  char16_t *msg;
  WebAssemblyModule *this_00;
  bool bVar3;
  undefined8 uStack_28;
  uint32 len;
  
  uStack_28 = (ulong)in_EAX;
  uVar1 = LEB128<unsigned_int,32u>(this,(uint32 *)((long)&uStack_28 + 4));
  this_00 = this->m_module;
  uVar2 = Js::WebAssemblyModule::GetWasmFunctionCount(this_00);
  if ((CARRY4(uVar2,uVar1)) || ((1000000 < uVar2 + uVar1 && (DAT_01430302 == '\0')))) {
    msg = L"Too many functions";
  }
  else {
    while( true ) {
      bVar3 = uVar1 == 0;
      uVar1 = uVar1 - 1;
      if (bVar3) {
        return;
      }
      index = LEB128<unsigned_int,32u>(this,(uint32 *)((long)&uStack_28 + 4));
      this_00 = this->m_module;
      uVar2 = Js::WebAssemblyModule::GetSignatureCount(this_00);
      if (uVar2 <= index) break;
      sig = Js::WebAssemblyModule::GetSignature(this->m_module,index);
      Js::WebAssemblyModule::AddWasmFunctionInfo(this->m_module,sig);
    }
    msg = L"Function signature is out of bound";
  }
  ThrowDecodingError((WasmBinaryReader *)this_00,msg);
}

Assistant:

void WasmBinaryReader::ReadFunctionSignatures()
{
    uint32 len = 0;
    uint32 nFunctions = LEB128(len);

    uint32 totalFunctions = 0;
    if (UInt32Math::Add(nFunctions, m_module->GetWasmFunctionCount(), &totalFunctions) || totalFunctions > Limits::GetMaxFunctions())
    {
        ThrowDecodingError(_u("Too many functions"));
    }

    for (uint32 iFunc = 0; iFunc < nFunctions; iFunc++)
    {
        uint32 sigIndex = LEB128(len);
        if (sigIndex >= m_module->GetSignatureCount())
        {
            ThrowDecodingError(_u("Function signature is out of bound"));
        }

        WasmSignature* sig = m_module->GetSignature(sigIndex);
        m_module->AddWasmFunctionInfo(sig);
    }
}